

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts_parallel.hpp
# Opt level: O0

void mcts::MCTS_parallel_<uttt::IBoard,uttt::RandomPlayout>(MCTSPNode *root,IBoard *root_game)

{
  __type _Var1;
  double dVar2;
  initializer_list<mcts::MCTSPNode_*> __l;
  IPlayer IVar3;
  bool bVar4;
  int iVar5;
  reference ppMVar6;
  size_type sVar7;
  reference ppMVar8;
  MCTSPNode *pMVar9;
  IBoard *in_RSI;
  MCTSPNode *in_RDI;
  uint i_1;
  int p_2;
  int status_1;
  IBoard new_game;
  MCTSPNode *new_node;
  long m;
  iterator __end0;
  iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> moves;
  uint i;
  int p_1;
  int status;
  double p;
  MCTSPNode *n;
  iterator __end3;
  iterator __begin3;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *__range3;
  IMove move;
  double min;
  MCTSPNode *child;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> nodes;
  int player;
  IBoard game;
  MCTSPNode *node;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe78;
  MCTSPNode *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  IBoard *in_stack_fffffffffffffe90;
  allocator_type *in_stack_fffffffffffffea8;
  double dVar10;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *this;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar11;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int iVar12;
  IBoard *in_stack_fffffffffffffee8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_100;
  undefined1 *local_f8;
  undefined1 local_f0 [8];
  IBoard *in_stack_ffffffffffffff18;
  RandomPlayout *in_stack_ffffffffffffff20;
  uint local_d4;
  int local_d0;
  __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
  local_b0;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *local_a8;
  IMove local_a0;
  double local_98;
  MCTSPNode *local_90;
  undefined1 local_71 [25];
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> local_58;
  int local_3c;
  IBoard local_38;
  MCTSPNode *local_18;
  MCTSPNode *local_8;
  
  local_38._16_8_ = *(undefined8 *)((in_RSI->micro)._M_elems + 6);
  local_38.macro = in_RSI->macro;
  local_38.micro._M_elems[0] = (in_RSI->micro)._M_elems[0];
  local_38.micro._M_elems[1] = (in_RSI->micro)._M_elems[1];
  local_38.micro._M_elems._4_8_ = *(undefined8 *)((in_RSI->micro)._M_elems + 2);
  local_18 = in_RDI;
  local_8 = in_RDI;
  IVar3 = uttt::IBoard::GetPlayerToMove(in_RSI);
  local_3c = 3 - IVar3;
  local_71._1_8_ = local_8;
  local_71._9_8_ = local_71 + 1;
  local_71._17_8_ = 1;
  this = (vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)local_71;
  std::allocator<mcts::MCTSPNode_*>::allocator((allocator<mcts::MCTSPNode_*> *)0x1f1062);
  __l._M_array._4_4_ = in_stack_fffffffffffffebc;
  __l._M_array._0_4_ = in_stack_fffffffffffffeb8;
  __l._M_len._0_4_ = in_stack_fffffffffffffec0;
  __l._M_len._4_4_ = in_stack_fffffffffffffec4;
  std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::vector
            (this,__l,in_stack_fffffffffffffea8);
  std::allocator<mcts::MCTSPNode_*>::~allocator((allocator<mcts::MCTSPNode_*> *)0x1f1093);
  while (bVar4 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::empty
                           ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                            in_stack_fffffffffffffe90), ((bVar4 ^ 0xffU) & 1) != 0) {
    local_90 = (MCTSPNode *)0x0;
    local_98 = 0.0;
    local_a0 = -1;
    local_a8 = &local_18->children;
    local_b0._M_current =
         (MCTSPNode **)
         std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::begin
                   ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                    in_stack_fffffffffffffe78);
    std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::end
              ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
               in_stack_fffffffffffffe78);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                               *)in_stack_fffffffffffffe78), bVar4) {
      ppMVar6 = __gnu_cxx::
                __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                ::operator*(&local_b0);
      pMVar9 = *ppMVar6;
      dVar10 = pMVar9->value / (double)pMVar9->total;
      _Var1 = std::log<long_long>(0x1f117d);
      dVar2 = sqrt((_Var1 * 2.0) / (double)pMVar9->total);
      if ((local_98 < dVar10 + dVar2) || (local_90 == (MCTSPNode *)0x0)) {
        local_a0 = pMVar9->move;
        local_98 = dVar10 + dVar2;
        local_90 = pMVar9;
      }
      __gnu_cxx::
      __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
      ::operator++(&local_b0);
    }
    local_18 = local_90;
    std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
              ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
               in_stack_fffffffffffffe90,
               (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    uttt::IBoard::ApplyMove
              (in_stack_fffffffffffffe90,
               (IMove *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  iVar5 = uttt::IBoard::GetStatus(&local_38);
  if (iVar5 == -1) {
    uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffee8);
    local_f8 = local_f0;
    local_100._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffe78);
    std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffe78);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffe78), bVar4) {
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                (&local_100);
      in_stack_fffffffffffffe90 = (IBoard *)operator_new(0x30);
      MCTSPNode::MCTSPNode(in_stack_fffffffffffffe80,(IMove)in_stack_fffffffffffffe78);
      uttt::IBoard::ApplyMove
                (in_stack_fffffffffffffe90,
                 (IMove *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                 in_stack_fffffffffffffe90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                 in_stack_fffffffffffffe90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_stack_fffffffffffffe8c =
           uttt::RandomPlayout::operator()(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      uVar11 = 0;
      iVar5 = local_3c;
      iVar12 = in_stack_fffffffffffffe8c;
      while( true ) {
        in_stack_fffffffffffffe80 = (MCTSPNode *)(ulong)uVar11;
        pMVar9 = (MCTSPNode *)
                 std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::size(&local_58)
        ;
        if (pMVar9 <= in_stack_fffffffffffffe80) break;
        ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_58,(ulong)uVar11);
        (*ppMVar8)->total = (*ppMVar8)->total + 1;
        if (iVar5 == iVar12) {
          ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                              (&local_58,(ulong)uVar11);
          (*ppMVar8)->value = (*ppMVar8)->value + 1.0;
        }
        else if (iVar12 == 0) {
          ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                              (&local_58,(ulong)uVar11);
          (*ppMVar8)->value = (*ppMVar8)->value + 0.5;
        }
        uVar11 = uVar11 + 1;
        iVar5 = 3 - iVar5;
      }
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::pop_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)0x1f1635);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&local_100);
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe90);
  }
  else {
    local_d0 = local_3c;
    for (local_d4 = 0;
        sVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::size(&local_58),
        local_d4 < sVar7; local_d4 = local_d4 + 1) {
      ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                          (&local_58,(ulong)local_d4);
      (*ppMVar8)->total = (*ppMVar8)->total + 1;
      if (local_d0 == iVar5) {
        ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_58,(ulong)local_d4);
        (*ppMVar8)->value = (*ppMVar8)->value + 1.0;
      }
      else if (iVar5 == 0) {
        ppMVar8 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_58,(ulong)local_d4);
        (*ppMVar8)->value = (*ppMVar8)->value + 0.5;
      }
      local_d0 = 3 - local_d0;
    }
  }
  std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::~vector
            ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
             in_stack_fffffffffffffe90);
  return;
}

Assistant:

static void
MCTS_parallel_(MCTSPNode *root, const IGame &root_game)
{
    auto node = root;
    auto game = root_game;
    auto player = 3 - root_game.GetPlayerToMove();
    std::vector<MCTSPNode *> nodes = {root};
    while (!node->children.empty())
    {
        MCTSPNode *child = nullptr;
        double min = 0.0;
        game::IMove move = -1;
        for (auto n : node->children)
        {
            double p = static_cast<double>(n->value) / n->total + std::sqrt(2.0 * std::log(node->total) / n->total);
            if (p > min || child == nullptr)
            {
                min = p;
                move = n->move;
                child = n;
            }
        }
        node = child;
        nodes.push_back(node);
        game.ApplyMove(move);
    }

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        auto p = player;
        for (unsigned i = 0; i < nodes.size(); ++i, p = 3 - p)
        {
            ++nodes[i]->total;
            if (p == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }
        return;
    }

    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        auto new_node = new MCTSPNode(m);
        auto new_game = game;
        new_game.ApplyMove(m);
        node->children.push_back(new_node);
        nodes.push_back(new_node);
        auto status = RandomPlayout()(new_game);
        auto p = player;
        for (unsigned i = 0; i < nodes.size(); ++i, p = 3 - p)
        {
            ++nodes[i]->total;
            if (p == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }
        nodes.pop_back();
    }
}